

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch-utils.h
# Opt level: O1

void __thiscall wasm::BranchUtils::anon_func::Scanner::~Scanner(Scanner *this)

{
  pointer pTVar1;
  
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&(this->targets)._M_t);
  pTVar1 = (this->super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>).
           super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar1 != (pointer)0x0) {
    operator_delete(pTVar1,(long)*(pointer *)
                                  ((long)&(this->
                                          super_PostWalker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                                          ).
                                          super_Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task,_std::allocator<wasm::Walker<Scanner,_wasm::UnifiedExpressionVisitor<Scanner,_void>_>::Task>_>
                                          ._M_impl.super__Vector_impl_data + 0x10) - (long)pTVar1);
    return;
  }
  return;
}

Assistant:

inline NameSet getExitingBranches(Expression* ast) {
  struct Scanner
    : public PostWalker<Scanner, UnifiedExpressionVisitor<Scanner>> {
    NameSet targets;

    void visitExpression(Expression* curr) {
      operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          targets.erase(name);
        }
      });
      operateOnScopeNameUses(curr, [&](Name& name) { targets.insert(name); });
    }
  };
  Scanner scanner;
  scanner.walk(ast);
  // anything not erased is a branch out
  return scanner.targets;
}